

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# geometry.c
# Opt level: O2

attr get_submesh_geometry_attr(geometry_t geometry,uint attr_index,ray *ray,hit *hit)

{
  submesh_geometry *submesh_geometry;
  attr aVar1;
  
  aVar1 = get_mesh_attr(*(mesh **)&geometry[1].node,attr_index,
                        (size_t)(geometry[1].node.hash + hit->primitive_index),&hit->uv);
  return aVar1;
}

Assistant:

static union attr get_submesh_geometry_attr(
    geometry_t geometry, unsigned attr_index,
    const struct ray* ray, const struct hit* hit)
{
    IGNORE(ray);
    struct submesh_geometry* submesh_geometry = (void*)geometry;
    return get_mesh_attr(
        submesh_geometry->mesh,
        attr_index,
        submesh_geometry->begin + hit->primitive_index,
        &hit->uv);
}